

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffClass(NodeDiffComputer *this,ClassDecl *lhs,ClassDecl *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  ClassDecl *in_RDX;
  ClassDecl *in_RSI;
  Node *in_RDI;
  TableDecl *in_stack_00000008;
  TableDecl *in_stack_00000010;
  NodeDiffComputer *in_stack_00000018;
  int32_t bodyDiff;
  int32_t baseDiff;
  int32_t keyDiff;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int32_t local_4;
  
  ClassDecl::classKey(in_RSI);
  ClassDecl::classKey(in_RDX);
  iVar1 = diffNodes((NodeDiffComputer *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (Node *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  local_4 = iVar1;
  if (iVar1 <= in_RDI[1]._coordinates.columnStart) {
    ClassDecl::classBase(in_RSI);
    ClassDecl::classBase(in_RDX);
    iVar2 = diffNodes((NodeDiffComputer *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                      (Node *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
    local_4 = iVar2;
    if ((iVar2 <= in_RDI[1]._coordinates.columnStart) &&
       (local_4 = diffTable(in_stack_00000018,in_stack_00000010,in_stack_00000008),
       local_4 <= in_RDI[1]._coordinates.columnStart)) {
      local_4 = iVar1 + iVar2 + local_4;
    }
  }
  return local_4;
}

Assistant:

int32_t diffClass(const ClassDecl *lhs, const ClassDecl *rhs) {
    int32_t keyDiff = diffNodes(lhs->classKey(), rhs->classKey());

    if (keyDiff > limit)
      return keyDiff;

    int32_t baseDiff = diffNodes(lhs->classBase(), rhs->classBase());

    if (baseDiff > limit)
      return baseDiff;

    int32_t bodyDiff = diffTable(lhs, rhs);

    if (bodyDiff > limit)
      return bodyDiff;

    return keyDiff + baseDiff + bodyDiff;
  }